

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O0

void __thiscall QSimplex::~QSimplex(QSimplex *this)

{
  clearDataStructures(this);
  QList<QSimplexVariable_*>::~QList((QList<QSimplexVariable_*> *)0xa5bb2a);
  QList<QSimplexConstraint_*>::~QList((QList<QSimplexConstraint_*> *)0xa5bb34);
  return;
}

Assistant:

QSimplex::~QSimplex()
{
    clearDataStructures();
}